

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ameth.c
# Opt level: O0

BIGNUM * gost_get0_priv_key(EVP_PKEY *pkey)

{
  int iVar1;
  EC_KEY *key;
  EVP_PKEY *in_RDI;
  EC_KEY *ec;
  BIGNUM *local_8;
  
  iVar1 = EVP_PKEY_get_base_id(in_RDI);
  if ((((iVar1 == 0x32b) || (iVar1 == 0x331)) || (iVar1 == 0x3d3 || iVar1 == 0x3d4)) &&
     (key = (EC_KEY *)EVP_PKEY_get0(in_RDI), key != (EC_KEY *)0x0)) {
    local_8 = EC_KEY_get0_private_key(key);
  }
  else {
    local_8 = (BIGNUM *)0x0;
  }
  return (BIGNUM *)local_8;
}

Assistant:

BIGNUM *gost_get0_priv_key(const EVP_PKEY *pkey)
{
    switch (EVP_PKEY_base_id(pkey)) {
    case NID_id_GostR3410_2012_512:
    case NID_id_GostR3410_2012_256:
    case NID_id_GostR3410_2001:
    case NID_id_GostR3410_2001DH:
        {
            EC_KEY *ec = EVP_PKEY_get0((EVP_PKEY *)pkey);
            if (ec)
                return (BIGNUM *)EC_KEY_get0_private_key(ec);
            break;
        }
    }
    return NULL;
}